

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O0

void __thiscall
duckdb::DataTable::AddIndex
          (DataTable *this,ColumnList *columns,vector<duckdb::LogicalIndex,_true> *column_indexes,
          IndexConstraintType type,IndexStorageInfo *index_info)

{
  bool bVar1;
  undefined8 uVar2;
  size_type column;
  vector<unsigned_long,_true> *args_2;
  DataTableInfo *this_00;
  undefined8 in_RDX;
  DataTable *in_RDI;
  templated_unique_single_t art;
  TableIOManager *io_manager;
  templated_unique_single_t ref;
  ColumnDefinition *col;
  ColumnBinding binding;
  LogicalIndex column_index;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalIndex,_true> *__range1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  vector<unsigned_long,_true> physical_ids;
  ColumnDefinition *in_stack_fffffffffffffe38;
  AttachedDatabase *pAVar3;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_stack_fffffffffffffe40;
  shared_ptr<duckdb::DataTableInfo,_true> *this_01;
  DataTable *in_stack_fffffffffffffe48;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  ColumnList *in_stack_fffffffffffffe88;
  LogicalIndex in_stack_fffffffffffffe90;
  _Head_base<0UL,_duckdb::Index_*,_false> in_stack_fffffffffffffeb0;
  element_type *in_stack_fffffffffffffeb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  PhysicalIndex in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  TransactionException *in_stack_fffffffffffffee0;
  AttachedDatabase *in_stack_fffffffffffffef0;
  void **in_stack_fffffffffffffef8;
  IndexStorageInfo *in_stack_ffffffffffffff00;
  __normal_iterator<const_duckdb::LogicalIndex_*,_std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
  local_e8;
  undefined8 local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  undefined1 local_a1;
  allocator local_49;
  string local_48 [48];
  undefined8 local_18;
  
  local_18 = in_RDX;
  bVar1 = IsMainTable((DataTable *)0xc490c2);
  if (!bVar1) {
    local_a1 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,
               "Transaction conflict: attempting to add an index to table \"%s\" but it has been %s by a different transaction"
               ,&local_49);
    GetTableName_abi_cxx11_(in_stack_fffffffffffffe48);
    TableModification_abi_cxx11_(in_RDI);
    TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0.index,in_stack_fffffffffffffec8);
    local_a1 = 0;
    __cxa_throw(uVar2,&TransactionException::typeinfo,TransactionException::~TransactionException);
  }
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0xc49231);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)0xc4923e);
  local_e0 = local_18;
  local_e8._M_current =
       (LogicalIndex *)
       ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::begin
                 ((vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)
                  in_stack_fffffffffffffe38);
  ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::end
            ((vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_> *)
             in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::LogicalIndex_*,_std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<const_duckdb::LogicalIndex_*,_std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalIndex_*,_std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
    ::operator*(&local_e8);
    column = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_c0);
    ColumnBinding::ColumnBinding((ColumnBinding *)&stack0xfffffffffffffef8,0,column);
    in_stack_fffffffffffffe90.index =
         (idx_t)ColumnList::GetColumn(in_stack_fffffffffffffe88,in_stack_fffffffffffffe90);
    in_stack_fffffffffffffef0 = (AttachedDatabase *)in_stack_fffffffffffffe90.index;
    in_stack_fffffffffffffe88 =
         (ColumnList *)
         ColumnDefinition::Name_abi_cxx11_((ColumnDefinition *)in_stack_fffffffffffffe90.index);
    ColumnDefinition::Type((ColumnDefinition *)in_stack_fffffffffffffef0);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffeb8,(LogicalType *)in_stack_fffffffffffffeb0._M_head_impl,
               (ColumnBinding *)in_RDI);
    unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
    unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffe40,
               (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                *)in_stack_fffffffffffffe38);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::push_back(in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xc4938e);
    in_stack_fffffffffffffed0 = ColumnDefinition::Physical(in_stack_fffffffffffffe38);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe40,
               (value_type_conflict1 *)in_stack_fffffffffffffe38);
    unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                   *)0xc493d3);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalIndex_*,_std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>_>
    ::operator++(&local_e8);
  }
  args_2 = (vector<unsigned_long,_true> *)TableIOManager::Get((DataTable *)0xc49451);
  pAVar3 = in_RDI->db;
  this_01 = (shared_ptr<duckdb::DataTableInfo,_true> *)&stack0xfffffffffffffeb8;
  make_uniq<duckdb::ART,std::__cxx11::string_const&,duckdb::IndexConstraintType_const&,duckdb::vector<unsigned_long,true>&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::AttachedDatabase&,decltype(nullptr),duckdb::IndexStorageInfo_const&>
            (in_stack_fffffffffffffed8,(IndexConstraintType *)in_stack_fffffffffffffed0.index,args_2
             ,(TableIOManager *)in_stack_fffffffffffffec0._M_pi,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)0x0,in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
  this_00 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_01);
  index = (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
          &stack0xfffffffffffffeb0;
  unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>,true>::
  unique_ptr<duckdb::ART,std::default_delete<std::unique_ptr<duckdb::Index,std::default_delete<duckdb::Index>>>,void>
            ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)this_01,
             (unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>_> *)pAVar3);
  TableIndexList::AddIndex((TableIndexList *)this_00,index);
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)0xc49524);
  unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ART,_std::default_delete<duckdb::ART>,_true> *)0xc49531);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)0xc4953e);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xc4954b);
  return;
}

Assistant:

void DataTable::AddIndex(const ColumnList &columns, const vector<LogicalIndex> &column_indexes,
                         const IndexConstraintType type, const IndexStorageInfo &index_info) {
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to add an index to table \"%s\" but it has been "
		                           "%s by a different transaction",
		                           GetTableName(), TableModification());
	}

	// Fetch the column types and create bound column reference expressions.
	vector<column_t> physical_ids;
	vector<unique_ptr<Expression>> expressions;

	for (const auto column_index : column_indexes) {
		auto binding = ColumnBinding(0, physical_ids.size());
		auto &col = columns.GetColumn(column_index);
		auto ref = make_uniq<BoundColumnRefExpression>(col.Name(), col.Type(), binding);
		expressions.push_back(std::move(ref));
		physical_ids.push_back(col.Physical().index);
	}

	// Create an ART around the expressions.
	auto &io_manager = TableIOManager::Get(*this);
	auto art = make_uniq<ART>(index_info.name, type, physical_ids, io_manager, std::move(expressions), db, nullptr,
	                          index_info);
	info->indexes.AddIndex(std::move(art));
}